

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_CustomMeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  TObjPtr<AActor> *obj;
  int iVar1;
  DAngle angle;
  bool bVar2;
  int iVar3;
  int iVar4;
  AActor *pAVar5;
  AActor *self;
  int iVar6;
  char *pcVar7;
  int iVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int local_48;
  FSoundID local_44;
  FName local_40;
  FSoundID local_3c;
  undefined8 local_38;
  
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003dcbc5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dcbb5:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dcbc5:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6a9,
                  "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003dc9ed;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dcbc5;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003dcbb5;
LAB_003dc9ed:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcc53:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6aa,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    local_48 = param[1].field_0.i;
LAB_003dca47:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcc72:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ab,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[2].field_0.i;
LAB_003dca56:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcc22:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ac,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[3].field_0.i;
LAB_003dca65:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcc03:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ad,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[4].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dcc53;
    }
    local_48 = param[1].field_0.i;
    if ((uint)numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003dca47;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dcc72;
    }
    iVar4 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003dca56;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dcc22;
    }
    iVar6 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003dca65;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dcc03;
    }
    iVar3 = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type != '\0') {
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003dcbe4;
      }
      goto LAB_003dca7f;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcbe4:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6ae,
                  "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003dca7f:
  iVar1 = param[5].field_0.i;
  iVar8 = 0x89;
  if (iVar3 != 0) {
    iVar8 = iVar3;
  }
  obj = &self->target;
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar5 != (AActor *)0x0) {
    A_FaceTarget(self);
    bVar2 = AActor::CheckMeleeRange(self);
    if (bVar2) {
      if (iVar4 != 0) {
        local_3c.ID = iVar4;
        S_Sound(self,1,&local_3c,1.0,1.0);
      }
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
      local_38 = 0;
      angle.Degrees._4_4_ = extraout_XMM0_Db;
      angle.Degrees._0_4_ = extraout_XMM0_Da;
      local_40.Index = iVar8;
      iVar4 = P_DamageMobj(pAVar5,self,self,local_48,&local_40,0,angle);
      if (iVar1 != 0) {
        if (0 < iVar4) {
          local_48 = iVar4;
        }
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        P_TraceBleed(local_48,pAVar5,self);
      }
    }
    else if (iVar6 != 0) {
      local_44.ID = iVar6;
      S_Sound(self,1,&local_44,1.0,1.0);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomMeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_SOUND_DEF	(misssound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (damagetype == NAME_None)
		damagetype = NAME_Melee;	// Melee is the default type

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else
	{
		if (misssound)
			S_Sound (self, CHAN_WEAPON, misssound, 1, ATTN_NORM);
	}
	return 0;
}